

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nucleus.cxx
# Opt level: O0

void __thiscall trento::Deuteron::sample_nucleons_impl(Deuteron *this)

{
  long in_RDI;
  double dVar1;
  __type _Var2;
  Nucleus *this_00;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  double z;
  double y;
  double x;
  double r_sin_theta;
  double phi;
  double cos_theta;
  double u;
  double prob;
  double r;
  undefined8 in_stack_ffffffffffffff68;
  __normal_iterator<trento::NucleonData_*,_std::vector<trento::NucleonData,_std::allocator<trento::NucleonData>_>_>
  __x;
  double in_stack_ffffffffffffff70;
  NucleonData *x_00;
  NucleonData *nucleon;
  __normal_iterator<trento::NucleonData_*,_std::vector<trento::NucleonData,_std::allocator<trento::NucleonData>_>_>
  local_60;
  __normal_iterator<trento::NucleonData_*,_std::vector<trento::NucleonData,_std::allocator<trento::NucleonData>_>_>
  local_58;
  double local_50;
  double local_48;
  double local_40;
  NucleonData *local_38;
  double local_30;
  double local_28;
  double local_20;
  Nucleus *local_18;
  NucleonData *local_10;
  
  do {
    local_20 = random::canonical<double>();
    dVar1 = log(local_20);
    local_10 = (NucleonData *)(-dVar1 / (*(double *)(in_RDI + 0x28) * 2.0));
    exp(-*(double *)(in_RDI + 0x28) * (double)local_10);
    exp(-*(double *)(in_RDI + 0x30) * (double)local_10);
    _Var2 = std::pow<double,int>
                      (in_stack_ffffffffffffff70,(int)((ulong)in_stack_ffffffffffffff68 >> 0x20));
    this_00 = (Nucleus *)(_Var2 / local_20);
    local_18 = this_00;
    dVar1 = random::canonical<double>();
  } while ((double)this_00 < dVar1);
  local_28 = random::cos_theta<double>();
  local_30 = random::phi<double>();
  auVar3._8_8_ = 0;
  auVar3._0_8_ = local_28;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = -local_28;
  auVar3 = vfmadd213sd_fma(auVar3,auVar4,ZEXT816(0x3ff0000000000000));
  __x._M_current = local_10;
  dVar1 = sqrt(auVar3._0_8_);
  x_00 = (NucleonData *)(__x._M_current * dVar1);
  local_38 = x_00;
  local_40 = cos(local_30);
  local_40 = (double)x_00 * local_40;
  nucleon = local_38;
  local_48 = sin(local_30);
  local_48 = (double)nucleon * local_48;
  local_50 = (double)local_10 * local_28;
  local_58._M_current = (NucleonData *)Nucleus::begin(__x._M_current);
  __gnu_cxx::
  __normal_iterator<trento::NucleonData_*,_std::vector<trento::NucleonData,_std::allocator<trento::NucleonData>_>_>
  ::operator*(&local_58);
  Nucleus::set_nucleon_position
            (this_00,nucleon,(double)x_00,(double)__x._M_current,6.53471479881112e-318);
  Nucleus::begin((Nucleus *)__x._M_current);
  local_60 = std::
             next<__gnu_cxx::__normal_iterator<trento::NucleonData*,std::vector<trento::NucleonData,std::allocator<trento::NucleonData>>>>
                       (__x,0x142eaf);
  __gnu_cxx::
  __normal_iterator<trento::NucleonData_*,_std::vector<trento::NucleonData,_std::allocator<trento::NucleonData>_>_>
  ::operator*(&local_60);
  Nucleus::set_nucleon_position
            (this_00,nucleon,(double)x_00,(double)__x._M_current,6.53543119399759e-318);
  return;
}

Assistant:

void Deuteron::sample_nucleons_impl() {
  // Sample the inter-nucleon radius using rejection sampling with an envelope
  // function.  The Hulthén wavefunction including the r^2 Jacobian expands to
  // three exponential terms:  exp(-2*a*r) + exp(-2*b*r) - 2*exp(-(a+b)*r).
  // This does not have a closed-form inverse CDF, however we can easily sample
  // exponential numbers from the term that falls off the slowest, i.e.
  // exp(-2*min(a,b)*r).  In the ctor initializer list the "a" parameter is
  // always set to the minimum, so we should sample from exp(-2*a*r).
  double r, prob;
  do {
    // Sample a uniform random number, u = exp(-2*a*r).
    auto u = random::canonical<double>();
    // Invert to find the actual radius.
    r = -std::log(u) / (2*a_);
    // The acceptance probability is now the radial wavefunction over the
    // envelope function, both evaluated at the proposal radius r.
    // Conveniently, the envelope evaluated at r is just the uniform random
    // number u.
    prob = std::pow(std::exp(-a_*r) - std::exp(-b_*r), 2) / u;
  } while (prob < random::canonical<double>());

  // Now sample spherical rotation angles.
  auto cos_theta = random::cos_theta<double>();
  auto phi = random::phi<double>();

  // And compute the Cartesian coordinates of one nucleon.
  auto r_sin_theta = r * std::sqrt(1. - cos_theta*cos_theta);
  auto x = r_sin_theta * std::cos(phi);
  auto y = r_sin_theta * std::sin(phi);
  auto z = r * cos_theta;

  // Place the first nucleon at the sampled coordinates.
  set_nucleon_position(*begin(), x, y, z);
  // Place the second nucleon opposite to the first.
  set_nucleon_position(*std::next(begin()), -x, -y, -z);
}